

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Result *__return_storage_ptr__,Expression_lhs *this)

{
  Expression_lhs EVar1;
  int in;
  char *__dest;
  uint uVar2;
  anon_union_24_2_13149d16_for_String_2 local_38;
  
  in = *(int *)this;
  EVar1 = this[5];
  if (((in != 0) == (bool)((byte)EVar1 & 1)) || (*(char *)(g_cs + 0x74) == '\x01')) {
    doctest::toString((String *)&local_38.data,in);
    __return_storage_ptr__->m_passed = (bool)((in != 0 ^ (byte)EVar1) & 1);
    if (local_38.buf[0x17] < '\0') {
      (__return_storage_ptr__->m_decomp).field_0.buf[0x17] = -0x80;
      (__return_storage_ptr__->m_decomp).field_0.data.size = local_38.data.size;
      uVar2 = local_38.data.size + 1;
      (__return_storage_ptr__->m_decomp).field_0.data.capacity = uVar2;
      __dest = (char *)operator_new__((ulong)uVar2);
      (__return_storage_ptr__->m_decomp).field_0.data.ptr = __dest;
      memcpy(__dest,local_38.data.ptr,(ulong)uVar2);
      if (local_38.data.ptr != (char *)0x0) {
        operator_delete__(local_38.data.ptr);
      }
    }
    else {
      *(ulong *)((long)&(__return_storage_ptr__->m_decomp).field_0 + 0x10) =
           CONCAT17(local_38.buf[0x17],local_38._16_7_);
      (__return_storage_ptr__->m_decomp).field_0.data.ptr = local_38.data.ptr;
      *(ulong *)((long)&(__return_storage_ptr__->m_decomp).field_0 + 8) =
           CONCAT44(local_38.data.capacity,local_38.data.size);
    }
  }
  else {
    __return_storage_ptr__->m_passed = true;
    (__return_storage_ptr__->m_decomp).field_0.data.ptr = (char *)0x0;
    (__return_storage_ptr__->m_decomp).field_0.buf[0x17] = '\x17';
  }
  return __return_storage_ptr__;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only foc MSVC 2015:
// https://ci.appveyor.com/project/onqtam/doctest/builds/38181202
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) //!OCLINT bitwise operator in conditional
                res = !res;

            if(!res || getContextOptions()->success)
                return Result(res, toString(lhs));
            return Result(res);
        }